

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O1

int kputsn_(void *p,int l,kstring_t *s)

{
  ulong uVar1;
  char *pcVar2;
  size_t __size;
  size_t __n;
  
  __n = (size_t)l;
  uVar1 = s->l + __n;
  if (s->m < uVar1) {
    uVar1 = uVar1 - 1;
    uVar1 = uVar1 >> 1 | uVar1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    __size = (uVar1 >> 0x10 | uVar1) + 1;
    s->m = __size;
    pcVar2 = (char *)realloc(s->s,__size);
    if (pcVar2 == (char *)0x0) goto LAB_0013e1d8;
    s->s = pcVar2;
  }
  pcVar2 = (char *)memcpy(s->s + s->l,p,__n);
  s->l = s->l + __n;
LAB_0013e1d8:
  return (int)pcVar2;
}

Assistant:

static inline int kputsn_(const void *p, int l, kstring_t *s)
{
	if (s->l + l > s->m) {
		char *tmp;
		s->m = s->l + l;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	memcpy(s->s + s->l, p, l);
	s->l += l;
	return l;
}